

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

void __thiscall
Js::LineOffsetCache::LineOffsetCache
          (LineOffsetCache *this,Recycler *allocator,charcount_t *lineCharacterOffsets,
          charcount_t *lineByteOffsets,int numberOfLines)

{
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar1;
  nullptr_t local_38;
  int local_2c;
  charcount_t *pcStack_28;
  int numberOfLines_local;
  charcount_t *lineByteOffsets_local;
  charcount_t *lineCharacterOffsets_local;
  Recycler *allocator_local;
  LineOffsetCache *this_local;
  
  local_2c = numberOfLines;
  pcStack_28 = lineByteOffsets;
  lineByteOffsets_local = lineCharacterOffsets;
  lineCharacterOffsets_local = &allocator->Cookie;
  allocator_local = (Recycler *)this;
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierPtr(&this->lineCharacterOffsetCacheList);
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierPtr(&this->lineByteOffsetCacheList);
  pRVar1 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::
           New<Memory::Recycler>
                     ((Recycler *)lineCharacterOffsets_local,lineByteOffsets_local,local_2c);
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  operator=(&this->lineCharacterOffsetCacheList,pRVar1);
  if (pcStack_28 == (uint *)0x0) {
    local_38 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
    ::operator=(&this->lineByteOffsetCacheList,&local_38);
  }
  else {
    pRVar1 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::
             New<Memory::Recycler>((Recycler *)lineCharacterOffsets_local,pcStack_28,local_2c);
    Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
    ::operator=(&this->lineByteOffsetCacheList,pRVar1);
  }
  return;
}

Assistant:

LineOffsetCache::LineOffsetCache(Recycler *allocator,
        _In_reads_(numberOfLines) const charcount_t *lineCharacterOffsets,
        _In_reads_opt_(numberOfLines) const charcount_t *lineByteOffsets,
        __in int numberOfLines)
    {
        this->lineCharacterOffsetCacheList = LineOffsetCacheReadOnlyList::New(allocator, (charcount_t *)lineCharacterOffsets, numberOfLines);
        if (lineByteOffsets)
        {
            this->lineByteOffsetCacheList = LineOffsetCacheReadOnlyList::New(allocator, (charcount_t *)lineByteOffsets, numberOfLines);
        }
        else
        {
            this->lineByteOffsetCacheList = nullptr;
        }
    }